

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O2

void __thiscall
QtMWidgets::DateTimePickerPrivate::initDaysMonthYearSectionIndex(DateTimePickerPrivate *this)

{
  Type TVar1;
  ulong uVar2;
  ulong uVar3;
  Section *pSVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar2 = (this->super_DateTimeParser).sections.d.size;
  uVar3 = 0;
  if ((long)uVar2 < 1) {
    uVar2 = uVar3;
  }
  pSVar4 = (this->super_DateTimeParser).sections.d.ptr;
  uVar5 = 0xffffffffffffffff;
  uVar7 = 0xffffffff;
  uVar6 = 0xffffffff;
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    TVar1 = pSVar4->type;
    if ((TVar1 & DaySectionMask) == NoSection) {
      if ((TVar1 & MonthSectionMask) == NoSection) {
        if ((TVar1 & YearSectionMask) != NoSection) {
          uVar6 = uVar3 & 0xffffffff;
        }
      }
      else {
        uVar7 = uVar3 & 0xffffffff;
      }
    }
    else {
      uVar5 = uVar3 & 0xffffffff;
    }
    pSVar4 = pSVar4 + 1;
  }
  this->daysSection = (int)uVar5;
  this->monthSection = (int)uVar7;
  this->yearSection = (int)uVar6;
  return;
}

Assistant:

void
DateTimePickerPrivate::initDaysMonthYearSectionIndex()
{
	int day = -1;
	int month = -1;
	int year = -1;

	for( int i = 0; i < sections.size(); ++i )
	{
		if( sections.at( i ).type & Section::DaySectionMask )
			day = i;
		else if( sections.at( i ).type & Section::MonthSectionMask )
			month = i;
		else if( sections.at( i ).type & Section::YearSectionMask )
			year = i;
	}

	daysSection = day;
	monthSection = month;
	yearSection = year;
}